

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O1

void DwaCompressor_destroy(DwaCompressor *me)

{
  void *pvVar1;
  int i;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (me->_packedAcBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_packedAcBuffer);
  }
  if (me->_packedDcBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_packedDcBuffer);
  }
  if (me->_rleBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_rleBuffer);
  }
  if (me->_channelData != (ChannelData *)0x0) {
    if (0 < me->_numChannels) {
      lVar2 = 0x1a0;
      lVar3 = 0;
      do {
        pvVar1 = *(void **)((long)(me->_channelData->_dctData)._dctData + lVar2 + -0x20);
        if (pvVar1 != (void *)0x0) {
          internal_exr_free(pvVar1);
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x240;
      } while (lVar3 < me->_numChannels);
    }
    internal_exr_free(me->_channelData);
  }
  if (me->_cscChannelSets != (CscChannelSet *)0x0) {
    internal_exr_free(me->_cscChannelSets);
  }
  if (me->_channelRules != sDefaultChannelRules && me->_channelRules != sLegacyChannelRules) {
    if (me->_channelRuleCount != 0) {
      lVar2 = 0;
      uVar4 = 0;
      do {
        pvVar1 = *(void **)((long)&me->_channelRules->_suffix + lVar2);
        if ((pvVar1 != (void *)0x0) && ((&me->_channelRules->_stringStatic)[lVar2] == '\0')) {
          internal_exr_free(pvVar1);
        }
        uVar4 = uVar4 + 1;
        lVar2 = lVar2 + 0x18;
      } while (uVar4 < me->_channelRuleCount);
    }
    internal_exr_free(me->_channelRules);
  }
  lVar2 = 0;
  do {
    if (me->_planarUncBuffer[lVar2] != (uint8_t *)0x0) {
      internal_exr_free(me->_planarUncBuffer[lVar2]);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

static void
DwaCompressor_destroy (DwaCompressor* me)
{
    if (me->_packedAcBuffer) internal_exr_free (me->_packedAcBuffer);
    if (me->_packedDcBuffer) internal_exr_free (me->_packedDcBuffer);
    if (me->_rleBuffer) internal_exr_free (me->_rleBuffer);

    if (me->_channelData)
    {
        for (int c = 0; c < me->_numChannels; ++c)
            DctCoderChannelData_destroy (&(me->_channelData[c]._dctData));

        internal_exr_free (me->_channelData);
    }

    if (me->_cscChannelSets) internal_exr_free (me->_cscChannelSets);
    if (me->_channelRules != sLegacyChannelRules &&
        me->_channelRules != sDefaultChannelRules)
    {
        for (size_t i = 0; i < me->_channelRuleCount; ++i)
            Classifier_destroy (&(me->_channelRules[i]));
        internal_exr_free (me->_channelRules);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (me->_planarUncBuffer[i])
            internal_exr_free (me->_planarUncBuffer[i]);
    }
}